

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<false> * __thiscall
ArrayState<false>::StartObject(ArrayState<false> *this,Context<false> *ctx)

{
  size_type sVar1;
  long in_RSI;
  BaseState<false> *in_stack_00000060;
  char *in_stack_00000068;
  Context<false> *in_stack_00000070;
  
  sVar1 = std::vector<Namespace<false>,_std::allocator<Namespace<false>_>_>::size
                    ((vector<Namespace<false>,_std::allocator<Namespace<false>_>_> *)(in_RSI + 0x30)
                    );
  if (sVar1 != 0) {
    Context<false>::CurrentNamespace((Context<false> *)0x306a30);
  }
  Context<false>::PushNamespace(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  return (BaseState<false> *)(in_RSI + 0x78);
}

Assistant:

BaseState<audit>* StartObject(Context<audit>& ctx)
  {
    // parse properties
    ctx.PushNamespace(ctx.namespace_path.size() > 0 ? ctx.CurrentNamespace().name : " ", this);

    return &ctx.default_state;
  }